

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsAbstractTableElement.cpp
# Opt level: O1

void __thiscall KDReports::AbstractTableElement::AbstractTableElement(AbstractTableElement *this)

{
  AbstractTableElementPrivate *pAVar1;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__AbstractTableElement_001742e0;
  pAVar1 = (AbstractTableElementPrivate *)operator_new(0x58);
  pAVar1->m_border = 1.0;
  QBrush::QBrush(&pAVar1->m_borderBrush,darkGray,SolidPattern);
  pAVar1->m_padding = 0.5;
  pAVar1->m_width = 0.0;
  pAVar1->m_unit = Millimeters;
  QFont::QFont(&pAVar1->m_defaultFont);
  pAVar1->m_fontSpecified = false;
  (pAVar1->m_constraints).d.d = (Data *)0x0;
  *(ColumnConstraint **)((long)&(pAVar1->m_constraints).d + 8) = (ColumnConstraint *)0x0;
  *(qsizetype *)((long)&(pAVar1->m_constraints).d + 0x10) = 0;
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::AbstractTableElementPrivate,_std::default_delete<KDReports::AbstractTableElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::AbstractTableElementPrivate_*,_std::default_delete<KDReports::AbstractTableElementPrivate>_>
  .super__Head_base<0UL,_KDReports::AbstractTableElementPrivate_*,_false>._M_head_impl = pAVar1;
  return;
}

Assistant:

KDReports::AbstractTableElement::AbstractTableElement()
    : Element()
    , d(new AbstractTableElementPrivate)
{
}